

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O1

void __thiscall
cmDynamicLoaderCache::CacheFile(cmDynamicLoaderCache *this,char *path,LibraryHandle *p)

{
  mapped_type pvVar1;
  bool bVar2;
  mapped_type *ppvVar3;
  LibraryHandle h;
  allocator local_49;
  key_type local_48;
  LibraryHandle local_28;
  
  bVar2 = GetCacheFile(this,path,&local_28);
  if (bVar2) {
    FlushCache(this,path);
  }
  pvVar1 = *p;
  std::__cxx11::string::string((string *)&local_48,path,&local_49);
  ppvVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](&this->CacheMap,&local_48);
  *ppvVar3 = pvVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmDynamicLoaderCache::CacheFile(const char* path,
  const cmsys::DynamicLoader::LibraryHandle& p)
{
  cmsys::DynamicLoader::LibraryHandle h;
  if ( this->GetCacheFile(path, h) )
    {
    this->FlushCache(path);
    }
  this->CacheMap[path] = p;
}